

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6c49c::data<Imath_3_2::half>::checkValues
          (data<Imath_3_2::half> *this,
          vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *data,Box2i *dw,
          bool dontbothercheckingdepth)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  undefined7 in_register_00000009;
  pointer pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  Box<Imath_3_2::Vec2<int>_> local_40;
  
  pbVar1 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size((Box<Imath_3_2::Vec2<int>_> *)&local_40.max);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(&local_40);
  lVar4 = (long)((local_40.min.y + 1) * (local_40.max.x + 1)) + ((long)pbVar1 - (long)pbVar2 >> 5);
  if ((int)CONCAT71(in_register_00000009,dontbothercheckingdepth) == 0) {
    lVar8 = 0;
    lVar7 = 0;
    for (lVar9 = 0; lVar4 != lVar9; lVar9 = lVar9 + 1) {
      pvVar6 = (this->_results).
               super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar10 = ABS(*(float *)(_imath_half_to_float_table +
                             (ulong)*(ushort *)
                                     (*(long *)&pvVar6[lVar7].
                                                super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                ._M_impl.super__Vector_impl_data + lVar8 * 2) * 4) -
                   *(float *)(_imath_half_to_float_table +
                             (ulong)(data->
                                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar9]._h * 4));
      if (0.005 < fVar10) {
        poVar5 = std::operator<<((ostream *)&std::cout,"sample ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," (channel ");
        poVar5 = std::operator<<(poVar5,(string *)
                                        ((this->_channels).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar8));
        poVar5 = std::operator<<(poVar5," of pixel ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,") ");
        poVar5 = std::operator<<((ostream *)&std::cout,"doesn\'t match expected value (channel ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," of pixel ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,") : ");
        poVar5 = std::operator<<((ostream *)&std::cout,"got ");
        poVar5 = (ostream *)
                 ::operator<<(poVar5,(half)(data->
                                           super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar9]._h);
        poVar5 = std::operator<<(poVar5," expected ");
        poVar5 = (ostream *)
                 ::operator<<(poVar5,(half)*(uint16_t *)
                                            (*(long *)&(this->_results).
                                                                                                              
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar8 * 2));
        std::endl<char,std::char_traits<char>>(poVar5);
        pvVar6 = (this->_results).
                 super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        fVar10 = ABS(*(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)
                                       (*(long *)&pvVar6[lVar7].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar8 * 2) * 4)
                     - *(float *)(_imath_half_to_float_table +
                                 (ulong)(data->
                                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                        )._M_impl.super__Vector_impl_data._M_start[lVar9]._h * 4));
      }
      if (0.005 < fVar10) {
        __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                      ,0x17e,
                      "void (anonymous namespace)::data<Imath_3_2::half>::checkValues(const vector<T> &, const Box2i &, bool) [T = Imath_3_2::half]"
                     );
      }
      lVar8 = lVar8 + 1;
      if (lVar8 == (long)(this->_channels).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_channels).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) {
        lVar7 = lVar7 + 1;
        if (lVar7 == ((long)(this->_results).
                            super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) {
          lVar7 = 0;
        }
        lVar8 = 0;
      }
    }
  }
  else {
    lVar9 = 0;
    lVar8 = 0;
    for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
      bVar3 = std::operator!=((this->_channels).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar9,"Z");
      if (bVar3) {
        bVar3 = std::operator!=((this->_channels).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar9,"ZBack");
        if (bVar3) {
          fVar10 = ABS(*(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)
                                         (*(long *)&(this->_results).
                                                                                                        
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar9 * 2) * 4)
                       - *(float *)(_imath_half_to_float_table +
                                   (ulong)(data->
                                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                          )._M_impl.super__Vector_impl_data._M_start[lVar7]._h * 4))
          ;
          if (0.005 < fVar10) {
            poVar5 = std::operator<<((ostream *)&std::cout,"sample ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5," (channel ");
            poVar5 = std::operator<<(poVar5,(string *)
                                            ((this->_channels).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar9));
            poVar5 = std::operator<<(poVar5," of pixel ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5,") ");
            poVar5 = std::operator<<((ostream *)&std::cout,"doesn\'t match expected value (channel "
                                    );
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5," of pixel ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5,") : ");
            poVar5 = std::operator<<((ostream *)&std::cout,"got ");
            poVar5 = (ostream *)
                     ::operator<<(poVar5,(half)(data->
                                               super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                               )._M_impl.super__Vector_impl_data._M_start[lVar7]._h)
            ;
            poVar5 = std::operator<<(poVar5," expected ");
            poVar5 = (ostream *)
                     ::operator<<(poVar5,(half)*(uint16_t *)
                                                (*(long *)&(this->_results).
                                                                                                                      
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar9 * 2));
            std::endl<char,std::char_traits<char>>(poVar5);
            fVar10 = ABS(*(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)
                                           (*(long *)&(this->_results).
                                                                                                            
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar9 * 2) * 4)
                         - *(float *)(_imath_half_to_float_table +
                                     (ulong)(data->
                                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                            )._M_impl.super__Vector_impl_data._M_start[lVar7]._h * 4
                                     ));
          }
          if (0.005 < fVar10) {
            __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                          ,0x166,
                          "void (anonymous namespace)::data<Imath_3_2::half>::checkValues(const vector<T> &, const Box2i &, bool) [T = Imath_3_2::half]"
                         );
          }
        }
      }
      lVar9 = lVar9 + 1;
      if (lVar9 == (long)(this->_channels).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_channels).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) {
        lVar8 = lVar8 + 1;
        if (lVar8 == ((long)(this->_results).
                            super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_results).
                           super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18) {
          lVar8 = 0;
        }
        lVar9 = 0;
      }
    }
  }
  return;
}

Assistant:

void checkValues (
        const vector<T>& data, const Box2i& dw, bool dontbothercheckingdepth)
    {
        size_t size =
            _channels.size () + (dw.size ().x + 1) * (dw.size ().y + 1);
        size_t pel     = 0;
        size_t channel = 0;
        if (dontbothercheckingdepth)
        {
            for (size_t i = 0; i < size; i++)
            {
                if (_channels[channel] != "Z" && _channels[channel] != "ZBack")
                {
                    if (fabs (_results[pel][channel] - data[i]) > 0.005)
                    {
                        cout << "sample " << i << " (channel "
                             << _channels[channel] << " of pixel "
                             << i % _channels.size () << ") ";
                        cout << "doesn't match expected value (channel "
                             << channel << " of pixel " << pel << ") : ";
                        cout << "got " << data[i] << " expected "
                             << _results[pel][channel] << endl;
                    }
                    assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                }
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
        else
        {
            for (size_t i = 0; i < size; i++)
            {
                if (fabs (_results[pel][channel] - data[i]) > 0.005)
                {
                    cout << "sample " << i << " (channel " << _channels[channel]
                         << " of pixel " << i % _channels.size () << ") ";
                    cout << "doesn't match expected value (channel " << channel
                         << " of pixel " << pel << ") : ";
                    cout << "got " << data[i] << " expected "
                         << _results[pel][channel] << endl;
                }
                assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
    }